

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTransform.h
# Opt level: O0

void __thiscall Assimp::STransformVecInfo::STransformVecInfo(STransformVecInfo *this)

{
  STransformVecInfo *this_local;
  
  aiUVTransform::aiUVTransform(&this->super_aiUVTransform);
  this->uvIndex = 0;
  this->mapU = aiTextureMapMode_Wrap;
  this->mapV = aiTextureMapMode_Wrap;
  this->lockedPos = 0xeeeeeeee;
  std::__cxx11::list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>::list
            (&this->updateList);
  return;
}

Assistant:

STransformVecInfo() AI_NO_EXCEPT
    : uvIndex(0)
    , mapU(aiTextureMapMode_Wrap)
    , mapV(aiTextureMapMode_Wrap)
    , lockedPos(AI_TT_UV_IDX_LOCK_NONE) {
        // empty
    }